

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Picture.cpp
# Opt level: O0

Color * __thiscall Picture::getColor(Picture *this,double x,double y)

{
  double *pdVar1;
  int *piVar2;
  Vector3 *A;
  Picture *in_RSI;
  Color *in_RDI;
  int nx;
  int ny;
  int j;
  int i;
  Color res;
  Vec<unsigned_char,_3> *in_stack_ffffffffffffff18;
  Vector3 *in_stack_ffffffffffffff20;
  Vector3 *in_stack_ffffffffffffff28;
  Color *alpha;
  Vector3 local_98;
  int local_7c;
  int local_78;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Vector3 local_58;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18 [3];
  
  local_28 = 0.0;
  alpha = in_RDI;
  pdVar1 = std::max<double>(local_18,&local_28);
  local_30 = 1.0;
  pdVar1 = std::min<double>(pdVar1,&local_30);
  local_18[0] = *pdVar1;
  local_38 = 0.0;
  pdVar1 = std::max<double>(&local_20,&local_38);
  local_40 = 1.0;
  pdVar1 = std::min<double>(pdVar1,&local_40);
  local_20 = (1.0 - *pdVar1) * (double)(in_RSI->rows + -1);
  local_18[0] = local_18[0] * (double)(in_RSI->cols + -1);
  Vector3::Vector3(&local_58,0.0);
  for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
      local_68 = (int)local_20 + local_5c;
      piVar2 = std::min<int>(&local_68,&in_RSI->rows);
      local_64 = *piVar2;
      local_7c = (int)local_18[0] + local_60;
      A = (Vector3 *)std::min<int>(&local_7c,&in_RSI->cols);
      local_78 = *(int *)&A->x;
      in_stack_ffffffffffffff20 =
           (Vector3 *)
           ((1.0 - ABS(local_20 - (double)local_64)) * (1.0 - ABS(local_18[0] - (double)local_78)));
      in_stack_ffffffffffffff28 = (Vector3 *)operator[](in_RSI,local_64);
      cv::operator*((double)alpha,(Vec<unsigned_char,_3> *)in_RDI);
      Vector3::Vector3<unsigned_char>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      operator+=(A,in_stack_ffffffffffffff28);
      Vector3::~Vector3(&local_98);
    }
  }
  operator/(in_stack_ffffffffffffff28,&in_stack_ffffffffffffff20->x);
  Vector3::~Vector3(&local_58);
  return alpha;
}

Assistant:

Color Picture::getColor(double x, double y) const
{
    x = min(max(x, 0.), 1.);
    y = min(max(y, 0.), 1.);
    y = (1 - y) * (rows - 1);
    x = x * (cols - 1);
    Color res;
    for (int i = 0; i < 2; ++i)
        for (int j = 0; j < 2; ++j) {
            int ny = std::min(int(y) + i, this->rows);
            int nx = std::min(int(x) + j, this->cols);
            res += (1 - fabs(y - ny)) * (1 - fabs(x - nx)) * (*this)[ny][nx];
        }
    return res / 255;
}